

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_handler.cc
# Opt level: O1

void_handler_t * make_print_message(void_handler_t *__return_storage_ptr__,string *msg)

{
  pointer pcVar1;
  undefined8 *puVar2;
  undefined1 *local_30;
  undefined8 local_28;
  undefined1 local_20;
  undefined7 uStack_1f;
  undefined8 uStack_18;
  
  pcVar1 = (msg->_M_dataplus)._M_p;
  local_30 = &local_20;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_30,pcVar1,pcVar1 + msg->_M_string_length);
  (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
  __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  puVar2 = (undefined8 *)operator_new(0x20);
  *puVar2 = puVar2 + 2;
  if (local_30 == &local_20) {
    puVar2[2] = CONCAT71(uStack_1f,local_20);
    puVar2[3] = uStack_18;
  }
  else {
    *puVar2 = local_30;
    puVar2[2] = CONCAT71(uStack_1f,local_20);
  }
  puVar2[1] = local_28;
  *(undefined8 **)&(__return_storage_ptr__->super__Function_base)._M_functor = puVar2;
  __return_storage_ptr__->_M_invoker =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/json_handler.cc:41:12)>
       ::_M_invoke;
  (__return_storage_ptr__->super__Function_base)._M_manager =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/json_handler.cc:41:12)>
       ::_M_manager;
  return __return_storage_ptr__;
}

Assistant:

static JSONHandler::void_handler_t
make_print_message(std::string msg)
{
    return [msg](std::string const& path) { std::cout << path << ": json: " << msg << std::endl; };
}